

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPMuxError MuxImagePush(WebPMuxImage *wpi,WebPMuxImage **wpi_list)

{
  WebPChunk *pWVar1;
  WebPChunk *pWVar2;
  WebPChunk *pWVar3;
  WebPChunk *pWVar4;
  WebPMuxImage **ppWVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  WebPMuxError WVar9;
  WebPMuxImage *pWVar10;
  WebPMuxImage **ppWVar11;
  
  pWVar10 = *wpi_list;
  ppWVar5 = wpi_list;
  for (; ppWVar11 = wpi_list, pWVar10 != (WebPMuxImage *)0x0; pWVar10 = pWVar10->next) {
    wpi_list = &pWVar10->next;
    ppWVar5 = ppWVar11;
  }
  pWVar10 = (WebPMuxImage *)WebPSafeMalloc(1,0x38);
  if (pWVar10 == (WebPMuxImage *)0x0) {
    WVar9 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    pWVar1 = wpi->header;
    pWVar2 = wpi->alpha;
    pWVar3 = wpi->img;
    pWVar4 = wpi->unknown;
    iVar6 = wpi->height;
    iVar7 = wpi->has_alpha;
    iVar8 = wpi->is_partial;
    pWVar10->width = wpi->width;
    pWVar10->height = iVar6;
    pWVar10->has_alpha = iVar7;
    pWVar10->is_partial = iVar8;
    pWVar10->img = pWVar3;
    pWVar10->unknown = pWVar4;
    pWVar10->header = pWVar1;
    pWVar10->alpha = pWVar2;
    pWVar10->next = (WebPMuxImage *)0x0;
    ppWVar11 = &(*ppWVar5)->next;
    if (*ppWVar5 == (WebPMuxImage *)0x0) {
      ppWVar11 = ppWVar5;
    }
    *ppWVar11 = pWVar10;
    WVar9 = WEBP_MUX_OK;
  }
  return WVar9;
}

Assistant:

WebPMuxError MuxImagePush(const WebPMuxImage* wpi, WebPMuxImage** wpi_list) {
  WebPMuxImage* new_wpi;

  while (*wpi_list != NULL) {
    WebPMuxImage* const cur_wpi = *wpi_list;
    if (cur_wpi->next == NULL) break;
    wpi_list = &cur_wpi->next;
  }

  new_wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*new_wpi));
  if (new_wpi == NULL) return WEBP_MUX_MEMORY_ERROR;
  *new_wpi = *wpi;
  new_wpi->next = NULL;

  if (*wpi_list != NULL) {
    (*wpi_list)->next = new_wpi;
  } else {
    *wpi_list = new_wpi;
  }
  return WEBP_MUX_OK;
}